

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::ScrollbarEx(ImRect *bb_frame,ImGuiID id,ImGuiAxis axis,float *p_scroll_v,
                       float size_avail_v,float size_contents_v,ImDrawCornerFlags rounding_corners)

{
  ImGuiWindow *pIVar1;
  ImDrawList *this;
  bool bVar2;
  ImGuiContext *pIVar3;
  ImVec2 *p_max;
  int iVar4;
  ImU32 IVar5;
  ImRect *pIVar6;
  ImGuiCol idx;
  bool bVar7;
  uint in_XMM0_Db;
  uint in_XMM0_Dc;
  undefined1 auVar8 [12];
  undefined1 auVar9 [12];
  uint in_XMM0_Dd;
  uint in_XMM1_Db;
  uint in_XMM1_Dc;
  uint in_XMM1_Dd;
  float fVar10;
  undefined1 auVar11 [12];
  float fVar12;
  float fVar13;
  float fVar14;
  bool held;
  bool hovered;
  ImRect bb;
  bool local_da;
  bool local_d9;
  ImRect local_d8;
  float local_bc;
  ImVec2 *local_b8;
  float local_b0;
  ImDrawCornerFlags local_ac;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  float local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  float local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  ImVec2 local_48;
  ImVec2 aIStack_40 [2];
  
  pIVar3 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  if (pIVar1->SkipItems == false) {
    fVar14 = (bb_frame->Max).x - (bb_frame->Min).x;
    if (fVar14 <= 0.0) {
      return (bool)'\0';
    }
    fVar13 = (bb_frame->Max).y - (bb_frame->Min).y;
    if (fVar13 <= 0.0) {
      return (bool)'\0';
    }
    fVar12 = 1.0;
    if (axis == ImGuiAxis_Y) {
      fVar10 = (GImGui->Style).FramePadding.y;
      fVar10 = fVar10 + fVar10;
      if (fVar13 < fVar10 + GImGui->FontSize) {
        fVar10 = (fVar13 - GImGui->FontSize) / fVar10;
        fVar12 = 1.0;
        if (fVar10 <= 1.0) {
          fVar12 = fVar10;
        }
        fVar12 = (float)(~-(uint)(fVar10 < 0.0) & (uint)fVar12);
      }
    }
    if (0.0 < fVar12) {
      local_58 = ZEXT416((uint)fVar12);
      fVar10 = (fVar14 + -2.0) * 0.5;
      iVar4 = (int)fVar10;
      fVar14 = -3.0;
      fVar12 = -3.0;
      if (iVar4 < 4) {
        fVar12 = -(float)(int)fVar10;
      }
      fVar10 = -0.0;
      if (-1 < iVar4) {
        fVar10 = fVar12;
      }
      fVar13 = (fVar13 + -2.0) * 0.5;
      iVar4 = (int)fVar13;
      if (iVar4 < 4) {
        fVar14 = -(float)(int)fVar13;
      }
      fVar13 = -0.0;
      if (-1 < iVar4) {
        fVar13 = fVar14;
      }
      local_d8.Min.x = (bb_frame->Min).x;
      local_d8.Min.y = (bb_frame->Min).y;
      local_d8.Min.x = local_d8.Min.x - fVar10;
      local_d8.Min.y = local_d8.Min.y - fVar13;
      local_d8.Max.x = (bb_frame->Max).x;
      local_d8.Max.x = fVar10 + local_d8.Max.x;
      local_d8.Max.y = (bb_frame->Max).y;
      local_d8.Max.y = fVar13 + local_d8.Max.y;
      if (axis == ImGuiAxis_X) {
        local_bc = local_d8.Max.x - local_d8.Min.x;
      }
      else {
        local_bc = local_d8.Max.y - local_d8.Min.y;
      }
      uStack_84 = in_XMM0_Db & in_XMM1_Db;
      uStack_80 = in_XMM0_Dc & in_XMM1_Dc;
      uStack_7c = in_XMM0_Dd & in_XMM1_Dd;
      local_88 = (float)(~-(uint)(size_avail_v <= size_contents_v) & (uint)size_avail_v |
                        -(uint)(size_avail_v <= size_contents_v) & (uint)size_contents_v);
      local_a8._4_4_ = in_XMM1_Db;
      local_a8._0_4_ = size_contents_v;
      local_a8._8_4_ = in_XMM1_Dc;
      local_a8._12_4_ = in_XMM1_Dd;
      local_ac = rounding_corners;
      local_78 = size_avail_v;
      if (0.0 < local_88) {
        local_b8 = &bb_frame->Max;
        local_98 = ZEXT416((uint)(GImGui->Style).GrabMinSize);
        local_da = false;
        local_d9 = false;
        uStack_74 = in_XMM0_Db;
        uStack_70 = in_XMM0_Dc;
        uStack_6c = in_XMM0_Dd;
        ButtonBehavior(&local_d8,id,&local_d9,&local_da,0x4000);
        fVar14 = local_88;
        if (local_88 <= 1.0) {
          fVar14 = 1.0;
        }
        fVar12 = (float)local_a8._0_4_ - local_78;
        fVar13 = (local_78 / fVar14) * local_bc;
        fVar14 = local_bc;
        if (fVar13 <= local_bc) {
          fVar14 = fVar13;
        }
        uStack_74 = uStack_74 & local_98._4_4_;
        uStack_70 = uStack_70 & local_98._8_4_;
        uStack_6c = uStack_6c & local_98._12_4_;
        local_78 = (float)(-(uint)(fVar13 < (float)local_98._0_4_) & local_98._0_4_ |
                          ~-(uint)(fVar13 < (float)local_98._0_4_) & (uint)fVar14);
        fVar14 = 1.0;
        if (1.0 <= fVar12) {
          fVar14 = fVar12;
        }
        fVar13 = *p_scroll_v / fVar14;
        auVar8 = ZEXT812(0x3f800000);
        if (fVar13 <= 1.0) {
          auVar8._4_8_ = 0;
          auVar8._0_4_ = fVar13;
        }
        local_a8._4_4_ = 0;
        local_a8._0_4_ =
             ((float)(~-(uint)(fVar13 < 0.0) & auVar8._0_4_) * (local_bc - local_78)) / local_bc;
        local_a8._8_4_ = auVar8._8_4_;
        local_a8._12_4_ = 0;
        if (((1.0 <= (float)local_58._0_4_) && (local_78 / local_bc < 1.0)) && (local_da != false))
        {
          local_98._0_4_ = fVar14;
          pIVar6 = (ImRect *)&local_d8.Min.y;
          if (axis == ImGuiAxis_X) {
            pIVar6 = &local_d8;
          }
          fVar14 = (*(float *)((pIVar3->IO).MouseDown + (ulong)(axis != ImGuiAxis_X) * 4 + -8) -
                   (pIVar6->Min).x) / local_bc;
          auVar9 = ZEXT812(0x3f800000);
          if (fVar14 <= 1.0) {
            auVar9._4_8_ = 0;
            auVar9._0_4_ = fVar14;
          }
          local_68._0_4_ = ~-(uint)(fVar14 < 0.0) & auVar9._0_4_;
          local_68._4_4_ = 0;
          local_68._8_4_ = auVar9._8_4_;
          local_68._12_4_ = 0;
          local_b0 = local_bc - local_78;
          local_88 = local_78 / local_bc;
          uStack_84 = uStack_74;
          uStack_80 = uStack_70;
          uStack_7c = uStack_6c;
          SetHoveredID(id);
          if (pIVar3->ActiveIdIsJustActivated == true) {
            bVar2 = local_88 + (float)local_a8._0_4_ < (float)local_68._0_4_;
            bVar7 = bVar2 || (float)local_68._0_4_ < (float)local_a8._0_4_;
            fVar14 = 0.0;
            if (!bVar2 && (float)local_68._0_4_ >= (float)local_a8._0_4_) {
              fVar14 = local_88 * -0.5 + ((float)local_68._0_4_ - (float)local_a8._0_4_);
            }
            pIVar3->ScrollbarClickDeltaToGrabCenter = fVar14;
          }
          else {
            bVar7 = false;
          }
          auVar11 = ZEXT812(0x3f800000);
          fVar13 = (((float)local_68._0_4_ - pIVar3->ScrollbarClickDeltaToGrabCenter) -
                   local_88 * 0.5) / (1.0 - local_88);
          fVar14 = 1.0;
          if (fVar13 <= 1.0) {
            fVar14 = fVar13;
          }
          fVar14 = (float)(int)((float)(~-(uint)(fVar13 < 0.0) & (uint)fVar14) *
                                (float)local_98._0_4_ + 0.5);
          *p_scroll_v = fVar14;
          fVar14 = fVar14 / (float)local_98._0_4_;
          if (fVar14 <= auVar11._0_4_) {
            auVar11._4_8_ = auVar11._4_8_;
            auVar11._0_4_ = fVar14;
          }
          fVar14 = (local_b0 * (float)(~-(uint)(fVar14 < 0.0) & auVar11._0_4_)) / local_bc;
          local_a8 = ZEXT416((uint)fVar14);
          if (bVar7) {
            pIVar3->ScrollbarClickDeltaToGrabCenter =
                 -local_88 * 0.5 + ((float)local_68._0_4_ - fVar14);
          }
        }
        p_max = local_b8;
        this = pIVar1->DrawList;
        IVar5 = GetColorU32(0xe,1.0);
        ImDrawList::AddRectFilled(this,&bb_frame->Min,p_max,IVar5,pIVar1->WindowRounding,local_ac);
        idx = 0x11;
        if (local_da == false) {
          idx = (local_d9 & 1) + 0xf;
        }
        IVar5 = GetColorU32(idx,(float)local_58._0_4_);
        if (axis == ImGuiAxis_X) {
          local_48.x = local_d8.Min.x + (local_d8.Max.x - local_d8.Min.x) * (float)local_a8._0_4_;
          aIStack_40[0].x = local_78 + local_48.x;
          local_48.y = local_d8.Min.y;
          aIStack_40[0].y = local_d8.Max.y;
        }
        else {
          local_48.y = (local_d8.Max.y - local_d8.Min.y) * (float)local_a8._0_4_ + local_d8.Min.y;
          aIStack_40[0].y = local_78 + local_48.y;
          aIStack_40[0].x = local_d8.Max.x;
          local_48.x = local_d8.Min.x;
        }
        ImDrawList::AddRectFilled
                  (pIVar1->DrawList,&local_48,aIStack_40,IVar5,(pIVar3->Style).ScrollbarRounding,0xf
                  );
        return local_da;
      }
      __assert_fail("ImMax(size_contents_v, size_avail_v) > 0.0f",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui_widgets.cpp"
                    ,0x354,
                    "bool ImGui::ScrollbarEx(const ImRect &, ImGuiID, ImGuiAxis, float *, float, float, ImDrawCornerFlags)"
                   );
    }
  }
  return false;
}

Assistant:

bool ImGui::ScrollbarEx(const ImRect& bb_frame, ImGuiID id, ImGuiAxis axis, float* p_scroll_v, float size_avail_v, float size_contents_v, ImDrawCornerFlags rounding_corners)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const float bb_frame_width = bb_frame.GetWidth();
    const float bb_frame_height = bb_frame.GetHeight();
    if (bb_frame_width <= 0.0f || bb_frame_height <= 0.0f)
        return false;

    // When we are too small, start hiding and disabling the grab (this reduce visual noise on very small window and facilitate using the resize grab)
    float alpha = 1.0f;
    if ((axis == ImGuiAxis_Y) && bb_frame_height < g.FontSize + g.Style.FramePadding.y * 2.0f)
        alpha = ImSaturate((bb_frame_height - g.FontSize) / (g.Style.FramePadding.y * 2.0f));
    if (alpha <= 0.0f)
        return false;

    const ImGuiStyle& style = g.Style;
    const bool allow_interaction = (alpha >= 1.0f);
    const bool horizontal = (axis == ImGuiAxis_X);

    ImRect bb = bb_frame;
    bb.Expand(ImVec2(-ImClamp(IM_FLOOR((bb_frame_width - 2.0f) * 0.5f), 0.0f, 3.0f), -ImClamp(IM_FLOOR((bb_frame_height - 2.0f) * 0.5f), 0.0f, 3.0f)));

    // V denote the main, longer axis of the scrollbar (= height for a vertical scrollbar)
    const float scrollbar_size_v = horizontal ? bb.GetWidth() : bb.GetHeight();

    // Calculate the height of our grabbable box. It generally represent the amount visible (vs the total scrollable amount)
    // But we maintain a minimum size in pixel to allow for the user to still aim inside.
    IM_ASSERT(ImMax(size_contents_v, size_avail_v) > 0.0f); // Adding this assert to check if the ImMax(XXX,1.0f) is still needed. PLEASE CONTACT ME if this triggers.
    const float win_size_v = ImMax(ImMax(size_contents_v, size_avail_v), 1.0f);
    const float grab_h_pixels = ImClamp(scrollbar_size_v * (size_avail_v / win_size_v), style.GrabMinSize, scrollbar_size_v);
    const float grab_h_norm = grab_h_pixels / scrollbar_size_v;

    // Handle input right away. None of the code of Begin() is relying on scrolling position before calling Scrollbar().
    bool held = false;
    bool hovered = false;
    ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_NoNavFocus);

    float scroll_max = ImMax(1.0f, size_contents_v - size_avail_v);
    float scroll_ratio = ImSaturate(*p_scroll_v / scroll_max);
    float grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;
    if (held && allow_interaction && grab_h_norm < 1.0f)
    {
        float scrollbar_pos_v = horizontal ? bb.Min.x : bb.Min.y;
        float mouse_pos_v = horizontal ? g.IO.MousePos.x : g.IO.MousePos.y;

        // Click position in scrollbar normalized space (0.0f->1.0f)
        const float clicked_v_norm = ImSaturate((mouse_pos_v - scrollbar_pos_v) / scrollbar_size_v);
        SetHoveredID(id);

        bool seek_absolute = false;
        if (g.ActiveIdIsJustActivated)
        {
            // On initial click calculate the distance between mouse and the center of the grab
            seek_absolute = (clicked_v_norm < grab_v_norm || clicked_v_norm > grab_v_norm + grab_h_norm);
            if (seek_absolute)
                g.ScrollbarClickDeltaToGrabCenter = 0.0f;
            else
                g.ScrollbarClickDeltaToGrabCenter = clicked_v_norm - grab_v_norm - grab_h_norm * 0.5f;
        }

        // Apply scroll
        // It is ok to modify Scroll here because we are being called in Begin() after the calculation of ContentSize and before setting up our starting position
        const float scroll_v_norm = ImSaturate((clicked_v_norm - g.ScrollbarClickDeltaToGrabCenter - grab_h_norm * 0.5f) / (1.0f - grab_h_norm));
        *p_scroll_v = IM_ROUND(scroll_v_norm * scroll_max);//(win_size_contents_v - win_size_v));

        // Update values for rendering
        scroll_ratio = ImSaturate(*p_scroll_v / scroll_max);
        grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;

        // Update distance to grab now that we have seeked and saturated
        if (seek_absolute)
            g.ScrollbarClickDeltaToGrabCenter = clicked_v_norm - grab_v_norm - grab_h_norm * 0.5f;
    }

    // Render
    window->DrawList->AddRectFilled(bb_frame.Min, bb_frame.Max, GetColorU32(ImGuiCol_ScrollbarBg), window->WindowRounding, rounding_corners);
    const ImU32 grab_col = GetColorU32(held ? ImGuiCol_ScrollbarGrabActive : hovered ? ImGuiCol_ScrollbarGrabHovered : ImGuiCol_ScrollbarGrab, alpha);
    ImRect grab_rect;
    if (horizontal)
        grab_rect = ImRect(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm), bb.Min.y, ImLerp(bb.Min.x, bb.Max.x, grab_v_norm) + grab_h_pixels, bb.Max.y);
    else
        grab_rect = ImRect(bb.Min.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm), bb.Max.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm) + grab_h_pixels);
    window->DrawList->AddRectFilled(grab_rect.Min, grab_rect.Max, grab_col, style.ScrollbarRounding);

    return held;
}